

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

wchar_t sftp_cmd_chmod(sftp_command *cmd)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  undefined8 in_RAX;
  size_t sVar4;
  uint uVar5;
  wchar_t wVar6;
  char *pcVar7;
  uint uVar8;
  byte *pbVar9;
  byte *__s;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  undefined8 local_38;
  
  if (backend == (Backend *)0x0) {
    not_connected();
  }
  else {
    if (cmd->nwords < 3) {
      pcVar7 = "chmod: expects a mode specifier and a filename";
      local_38 = in_RAX;
    }
    else {
      local_38 = 0;
      __s = (byte *)cmd->words[1];
      bVar10 = *__s;
      if (9 < (byte)(bVar10 - 0x30)) {
        uVar8 = 0;
        uVar3 = 0;
LAB_00110d21:
        if (bVar10 != 0) {
          uVar11 = 0;
          pbVar9 = __s;
          do {
            pbVar9 = pbVar9 + 1;
            if (bVar10 == 0x61) {
              uVar13 = 0xdff;
            }
            else if (bVar10 == 0x67) {
              uVar13 = 0x438;
            }
            else if (bVar10 == 0x6f) {
              uVar13 = 7;
            }
            else {
              uVar13 = 0x9c0;
              uVar5 = (uint)bVar10;
              if (uVar5 != 0x75) goto LAB_00110d70;
            }
            uVar11 = uVar11 | uVar13;
            bVar10 = *pbVar9;
          } while( true );
        }
        goto LAB_00110eee;
      }
      sVar4 = strspn((char *)__s,"01234567");
      if (__s[sVar4] == 0) {
        local_38._0_4_ = 0xfff;
        __isoc99_sscanf(__s,"%o",(long)&local_38 + 4);
        local_38 = CONCAT44(local_38._4_4_ & (uint)local_38,(uint)local_38);
LAB_00110eee:
        wVar6 = L'\x01';
        for (uVar12 = 2; uVar12 < cmd->nwords; uVar12 = uVar12 + 1) {
          _Var2 = wildcard_iterate(cmd->words[uVar12],sftp_action_chmod,&local_38);
          wVar6 = wVar6 & (uint)_Var2;
        }
        return wVar6;
      }
      pcVar7 = "chmod: numeric file modes should contain digits 0-7 only";
    }
    puts(pcVar7);
  }
  return L'\0';
switchD_00110db4_default:
  if ((bVar1 != 0) && (bVar1 != 0x2c)) {
switchD_00110db4_caseD_75:
    sVar4 = strcspn((char *)__s,",");
    uVar3 = (uint)sVar4;
    pcVar7 = "chmod: file mode \'%.*s\' contains unrecognised permission specifier \'%c\'\n";
    bVar10 = bVar1;
    goto LAB_00110f5b;
  }
  if (((uVar11 & 0xdff) != 0) || ((uVar13 & ~uVar11) == 0)) {
    uVar13 = uVar13 & uVar11;
    if (bVar10 == 0x3d) {
      uVar3 = uVar3 | uVar11;
      uVar8 = uVar8 | uVar13;
    }
    else if (uVar5 == 0x2d) {
      uVar3 = uVar3 | uVar13;
      uVar8 = uVar8 & ~uVar13;
    }
    else {
      if (bVar10 != 0x2b) goto LAB_00110e76;
      uVar3 = uVar3 | uVar13;
      uVar8 = uVar8 | uVar13;
    }
    local_38 = CONCAT44(uVar8,uVar3);
LAB_00110e76:
    __s = pbVar9 + (*pbVar9 != 0);
    bVar10 = *__s;
    goto LAB_00110d21;
  }
  sVar4 = strcspn((char *)__s,",");
  uVar3 = (uint)sVar4;
  pcVar7 = 
  "chmod: file mode \'%.*s\' contains no user/group/other specifier and permissions other than \'t\' \n"
  ;
  goto LAB_00110eb3;
LAB_00110d70:
  if (uVar5 < 0x3e) {
    if ((0x2000280000000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      if ((0x100000000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_00110f41;
    }
    else {
      bVar1 = *pbVar9;
      if ((bVar1 != 0) && (bVar1 != 0x2c)) {
        uVar13 = 0;
        do {
          switch(bVar1) {
          case 0x72:
            uVar13 = uVar13 | 0x124;
            break;
          case 0x73:
            if (((uVar11 & 0xdff) != 0x438) && ((uVar11 & 0xdff) != 0x9c0)) {
              sVar4 = strcspn((char *)__s,",");
              uVar3 = (uint)sVar4;
              pcVar7 = 
              "chmod: file mode \'%.*s\': set[ug]id bit should be used with exactly one of u or g only\n"
              ;
              goto LAB_00110eb3;
            }
            uVar13 = uVar13 | 0xc00;
            break;
          case 0x74:
            uVar13 = uVar13 | 0x200;
            uVar11 = uVar11 | 0x200;
            break;
          case 0x75:
          case 0x76:
            goto switchD_00110db4_caseD_75;
          case 0x77:
            uVar13 = uVar13 | 0x92;
            break;
          case 0x78:
            uVar13 = uVar13 | 0x49;
            break;
          default:
            goto switchD_00110db4_default;
          }
          bVar1 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
        } while( true );
      }
    }
    sVar4 = strcspn((char *)__s,",");
    uVar3 = (uint)sVar4;
    pcVar7 = "chmod: file mode \'%.*s\' is incomplete\n";
LAB_00110eb3:
    printf(pcVar7,(ulong)uVar3,__s);
    return L'\0';
  }
LAB_00110f41:
  sVar4 = strcspn((char *)__s,",");
  uVar3 = (uint)sVar4;
  pcVar7 = "chmod: file mode \'%.*s\' contains unrecognised user/group/other specifier \'%c\'\n";
LAB_00110f5b:
  printf(pcVar7,(ulong)uVar3,__s,(ulong)(uint)(int)(char)bVar10);
  return L'\0';
}

Assistant:

int sftp_cmd_chmod(struct sftp_command *cmd)
{
    char *mode;
    int i, ret;
    struct sftp_context_chmod ctx[1];

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 3) {
        printf("chmod: expects a mode specifier and a filename\n");
        return 0;
    }

    /*
     * Attempt to parse the mode specifier in cmd->words[1]. We
     * don't support the full horror of Unix chmod; instead we
     * support a much simpler syntax in which the user can either
     * specify an octal number, or a comma-separated sequence of
     * [ugoa]*[-+=][rwxst]+. (The initial [ugoa] sequence may
     * _only_ be omitted if the only attribute mentioned is t,
     * since all others require a user/group/other specification.
     * Additionally, the s attribute may not be specified for any
     * [ugoa] specifications other than exactly u or exactly g.
     */
    ctx->attrs_clr = ctx->attrs_xor = 0;
    mode = cmd->words[1];
    if (mode[0] >= '0' && mode[0] <= '9') {
        if (mode[strspn(mode, "01234567")]) {
            printf("chmod: numeric file modes should"
                   " contain digits 0-7 only\n");
            return 0;
        }
        ctx->attrs_clr = 07777;
        sscanf(mode, "%o", &ctx->attrs_xor);
        ctx->attrs_xor &= ctx->attrs_clr;
    } else {
        while (*mode) {
            char *modebegin = mode;
            unsigned subset, perms;
            int action;

            subset = 0;
            while (*mode && *mode != ',' &&
                   *mode != '+' && *mode != '-' && *mode != '=') {
                switch (*mode) {
                  case 'u': subset |= 04700; break; /* setuid, user perms */
                  case 'g': subset |= 02070; break; /* setgid, group perms */
                  case 'o': subset |= 00007; break; /* just other perms */
                  case 'a': subset |= 06777; break; /* all of the above */
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " user/group/other specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            action = *mode++;
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms = 0;
            while (*mode && *mode != ',') {
                switch (*mode) {
                  case 'r': perms |= 00444; break;
                  case 'w': perms |= 00222; break;
                  case 'x': perms |= 00111; break;
                  case 't': perms |= 01000; subset |= 01000; break;
                  case 's':
                    if ((subset & 06777) != 04700 &&
                        (subset & 06777) != 02070) {
                        printf("chmod: file mode '%.*s': set[ug]id bit should"
                               " be used with exactly one of u or g only\n",
                               (int)strcspn(modebegin, ","), modebegin);
                        return 0;
                    }
                    perms |= 06000;
                    break;
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " permission specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!(subset & 06777) && (perms &~ subset)) {
                printf("chmod: file mode '%.*s' contains no user/group/other"
                       " specifier and permissions other than 't' \n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms &= subset;
            switch (action) {
              case '+':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor |= perms;
                break;
              case '-':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor &= ~perms;
                break;
              case '=':
                ctx->attrs_clr |= subset;
                ctx->attrs_xor |= perms;
                break;
            }
            if (*mode) mode++;         /* eat comma */
        }
    }

    ret = 1;
    for (i = 2; i < cmd->nwords; i++)
        ret &= wildcard_iterate(cmd->words[i], sftp_action_chmod, ctx);

    return ret;
}